

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SchemaErrorPointer
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,SchemaErrorCode code,PointerType *location,Ch *value,SizeType length,
          PointerType *pointer)

{
  GValue *this_00;
  StringRefType *pSVar1;
  Data local_78;
  PointerType *local_60;
  PointerType *local_58;
  StringRefType local_50;
  StringRefType local_40;
  
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)0x3000000000000;
  this_00 = &this->currentError_;
  local_60 = pointer;
  local_58 = location;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
            (this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s);
  pSVar1 = GetValueString();
  local_40.s = pSVar1->s;
  local_40.length = pSVar1->length;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s,value,
             length,this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_40,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s,
             this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s);
  pSVar1 = GetOffsetString();
  local_50.s = pSVar1->s;
  local_50.length = pSVar1->length;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember<unsigned_int>
            (this_00,&local_50,(uint)local_60->parseErrorOffset_,this->allocator_);
  AddCurrentError(this,code,local_58);
  return;
}

Assistant:

void SchemaErrorPointer(const SchemaErrorCode code, const PointerType& location, const Ch* value, SizeType length, const PointerType& pointer) {
      currentError_ = GValue(kObjectType);
      currentError_.AddMember(GetValueString(), GValue(value, length, *allocator_).Move(), *allocator_);
      currentError_.AddMember(GetOffsetString(), static_cast<SizeType>(pointer.GetParseErrorOffset() / sizeof(Ch)), *allocator_);
      AddCurrentError(code, location);
    }